

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

int cali_channel_is_active(cali_id_t chn_id)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  Channel channel;
  undefined1 local_230 [16];
  undefined1 local_220 [248];
  ios_base local_128 [264];
  int local_20;
  
  cali::Caliper::instance();
  cali::Caliper::get_channel((Caliper *)local_230,(cali_id_t)local_220);
  if (((GlobalData *)local_230._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_230._8_8_ + 8) < 1)) {
    poVar3 = (ostream *)local_220;
    std::ofstream::ofstream(poVar3);
    local_20 = 0;
    iVar2 = cali::Log::verbosity();
    if (local_20 <= iVar2) {
      poVar3 = cali::Log::get_stream((Log *)local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"cali_channel_is_active(): invalid channel id ",0x2d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + _VTT[-1].process_snapshot.m_builder.m_len) =
         ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    std::ios_base::~ios_base(local_128);
    uVar4 = 0;
  }
  else {
    bVar1 = cali::Channel::is_active((Channel *)local_230);
    uVar4 = (uint)bVar1;
  }
  cali::Channel::~Channel((Channel *)local_230);
  return uVar4;
}

Assistant:

int cali_channel_is_active(cali_id_t chn_id)
{
    Channel channel = Caliper::instance().get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "cali_channel_is_active(): invalid channel id " << chn_id << std::endl;
        return 0;
    }

    return (channel.is_active() ? 1 : 0);
}